

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketIO.cpp
# Opt level: O2

char * ip6tos(sockaddr *sockaddr,char *address,int addrlen)

{
  int iVar1;
  
  iVar1 = getnameinfo((sockaddr *)sockaddr,0x80,address,addrlen,(char *)0x0,0,1);
  if (iVar1 != 0) {
    address = (char *)0x0;
  }
  return address;
}

Assistant:

char* ip6tos(struct sockaddr* sockaddr, char* address, int addrlen)
{
    socklen_t sockaddrlen;

#ifdef WIN32
    sockaddrlen = sizeof(struct sockaddr_in6);
#else
    sockaddrlen = sizeof(struct sockaddr_storage);
#endif

    if (getnameinfo(sockaddr, sockaddrlen, address, addrlen, nullptr, 0, NI_NUMERICHOST) != 0)
        address = nullptr;

    return address;
}